

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pardiso_interface.c
# Opt level: O0

c_int solve_linsys_pardiso(pardiso_solver *s,c_float *b)

{
  void **unaff_RBX;
  c_int *in_RSI;
  c_int *in_RDI;
  c_float *in_stack_00000010;
  c_int *in_stack_00000018;
  c_int *in_stack_00000020;
  c_int *in_stack_00000028;
  c_int *in_stack_00000030;
  c_int *in_stack_00000038;
  c_int *in_stack_00000040;
  c_float *in_stack_00000048;
  c_float *in_stack_00000050;
  c_int *in_stack_00000058;
  c_int j;
  c_int *in_stack_ffffffffffffffb0;
  long lVar1;
  c_int *in_stack_ffffffffffffffc8;
  c_int cVar2;
  
  in_RDI[0x95] = 0x21;
  pardiso(unaff_RBX,in_stack_ffffffffffffffc8,in_RDI,in_RSI,in_stack_ffffffffffffffb0,in_RDI + 0x96,
          in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
          in_stack_00000038,in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058)
  ;
  if (in_RDI[0x96] == 0) {
    if (in_RDI[0xd] == 0) {
      for (lVar1 = 0; lVar1 < in_RDI[0xe]; lVar1 = lVar1 + 1) {
        in_RSI[lVar1] = *(c_int *)(in_RDI[10] + lVar1 * 8);
      }
      for (lVar1 = 0; lVar1 < in_RDI[0xf]; lVar1 = lVar1 + 1) {
        in_RSI[lVar1 + in_RDI[0xe]] =
             (c_int)(*(double *)(in_RDI[0xb] + lVar1 * 8) *
                     *(double *)(in_RDI[10] + (lVar1 + in_RDI[0xe]) * 8) +
                    (double)in_RSI[lVar1 + in_RDI[0xe]]);
      }
    }
    cVar2 = 0;
  }
  else {
    printf("ERROR in %s: ","solve_linsys_pardiso");
    printf("Error during linear system solution: %d",in_RDI[0x96] & 0xffffffff);
    printf("\n");
    cVar2 = 1;
  }
  return cVar2;
}

Assistant:

c_int solve_linsys_pardiso(pardiso_solver * s, c_float * b) {
    c_int j;

    // Back substitution and iterative refinement
    s->phase = PARDISO_SOLVE;
    pardiso (s->pt, &(s->maxfct), &(s->mnum), &(s->mtype), &(s->phase),
             &(s->nKKT), s->KKT->x, s->KKT_p, s->KKT_i, &(s->idum), &(s->nrhs),
             s->iparm, &(s->msglvl), b, s->sol, &(s->error));
    if ( s->error != 0 ){
#ifdef PRINTING
        c_eprint("Error during linear system solution: %d", (int)s->error);
#endif
        return 1;
    }

    if (!(s->polish)) {
        /* copy x_tilde from s->sol */
        for (j = 0 ; j < s->n ; j++) {
            b[j] = s->sol[j];
        }

        /* compute z_tilde from b and s->sol */
        for (j = 0 ; j < s->m ; j++) {
            b[j + s->n] += s->rho_inv_vec[j] * s->sol[j + s->n];
        }
    }

    return 0;
}